

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::DatabaseInterface::test_resource_filter
          (DatabaseInterface *this,ResourceTag tag,Hash hash)

{
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var1;
  DatabaseInterface *pDVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  size_type sVar6;
  Impl *pIVar7;
  Hash local_18;
  
  uVar3 = (ulong)tag;
  pIVar7 = this->impl;
  local_18 = hash;
  if ((pIVar7->whitelist_tag_mask >> (tag & 0x1f) & 1) != 0) {
    _Var1._M_head_impl =
         (pIVar7->whitelist)._M_t.
         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (DatabaseInterface *)0x0) {
      if ((pIVar7->sub_databases_in_whitelist).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pIVar7->sub_databases_in_whitelist).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00141951;
    }
    else {
      cVar4 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_DatabaseInterface + 0x28))
                        (_Var1._M_head_impl,uVar3);
      pIVar7 = this->impl;
      if (cVar4 != '\0') goto LAB_00141951;
    }
    sVar6 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&pIVar7->implicit_whitelisted[uVar3]._M_h,&local_18);
    if (sVar6 == 0) {
      return false;
    }
    pIVar7 = this->impl;
  }
LAB_00141951:
  pDVar2 = (pIVar7->blacklist)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar2 != (DatabaseInterface *)0x0) &&
     (iVar5 = (*pDVar2->_vptr_DatabaseInterface[5])(pDVar2,uVar3,local_18), (char)iVar5 != '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool DatabaseInterface::test_resource_filter(ResourceTag tag, Hash hash) const
{
	if ((impl->whitelist_tag_mask & (1u << tag)) != 0)
	{
		bool whitelist_sensitive = impl->whitelist || !impl->sub_databases_in_whitelist.empty();
		if (whitelist_sensitive)
		{
			bool whitelisted = (impl->whitelist && impl->whitelist->has_entry(tag, hash)) ||
			                   (impl->implicit_whitelisted[tag].count(hash) != 0);
			if (!whitelisted)
				return false;
		}
	}

	if (impl->blacklist && impl->blacklist->has_entry(tag, hash))
		return false;

	return true;
}